

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_SizeHintDictatesTotalSize_Test::TestBody
          (CordOutputStreamTest_SizeHintDictatesTotalSize_Test *this)

{
  int iVar1;
  undefined1 *puVar2;
  bool bVar3;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  pointer message;
  char *in_R9;
  AssertionResult gtest_ar;
  int size;
  Cord cord;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  void *data;
  CordOutputStream output;
  undefined1 local_178 [8];
  undefined1 auStack_170 [48];
  int local_140;
  int local_13c;
  anon_union_16_2_39e9c77e_for_Rep_0 local_138;
  string local_128;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  AssertHelper local_c8;
  long *local_c0;
  undefined1 local_b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Alloc_hider local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  CordOutputStream local_80;
  anon_union_16_2_39e9c77e_for_Rep_0 local_48;
  
  puVar2 = (undefined1 *)((long)&local_80.cord_.contents_.data_ + 8);
  local_80.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = (_func_int **)puVar2;
  std::__cxx11::string::_M_construct((ulong)(local_88 + 8),-0xc);
  absl::lts_20250127::Cord::
  Cord<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((Cord *)&local_138.as_tree,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 8));
  if (local_80.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != (_func_int **)puVar2) {
    operator_delete(local_80.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream,
                    (ulong)((long)&(local_80.cord_.contents_.data_.rep_.field_0.as_tree.rep)->length
                           + 1));
  }
  local_48.as_tree.cordz_info = local_138.as_tree.cordz_info;
  local_48.as_tree.rep = local_138.as_tree.rep;
  local_138.as_tree.cordz_info = 0;
  local_138.as_tree.rep = (CordRep *)0x0;
  CordOutputStream::CordOutputStream
            ((CordOutputStream *)(local_88 + 8),(Cord *)&local_48.as_tree,2000);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_48.as_tree);
  local_140 = 0x5dc;
  do {
    bVar3 = CordOutputStream::Next((CordOutputStream *)(local_88 + 8),(void **)local_88,&local_13c);
    local_108[0] = bVar3;
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar3) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_178,(internal *)local_108,
                 (AssertionResult *)"output.Next(&data, &size)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x4a8,(char *)local_178);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_178 != (undefined1  [8])(auStack_170 + 8)) {
        operator_delete((void *)local_178,auStack_170._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_128._M_dataplus._M_p + 8))();
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
      }
      if (!bVar3) goto LAB_00b60c49;
    }
    testing::internal::CmpHelperLE<int,int>
              ((internal *)local_178,"size","remaining",&local_13c,&local_140);
    if ((internal)local_178[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_170._0_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = *(char **)auStack_170._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x4a9,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)local_108);
      goto LAB_00b60bbc;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_170._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)auStack_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_170._0_8_);
    }
    memset((void *)local_88,0x62,(long)local_13c);
    iVar1 = local_140 - local_13c;
    bVar3 = local_13c <= local_140;
    local_140 = iVar1;
  } while (iVar1 != 0 && bVar3);
  local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_178,"remaining","0",&local_140,(int *)local_108);
  if ((internal)local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_108);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_170._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)auStack_170._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x4ad,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)local_108);
LAB_00b60bbc:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_108 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_170._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00b60c49;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)auStack_170;
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               auStack_170._0_8_;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_170._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)auStack_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_170._0_8_);
    }
    CordOutputStream::Consume((CordOutputStream *)local_178);
    if ((local_138.as_tree.cordz_info & 1U) != 0) {
      absl::lts_20250127::Cord::InlineRep::UnrefTree((InlineRep *)&local_138.as_tree);
    }
    local_138.as_tree.cordz_info = (cordz_info_t)local_178;
    local_138.as_tree.rep = (CordRep *)auStack_170._0_8_;
    local_178 = (undefined1  [8])0x0;
    auStack_170._0_8_ = 0;
    absl::lts_20250127::Cord::~Cord((Cord *)local_178);
    local_c8.data_ = (AssertHelperData *)local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,-0xc);
    local_178 = (undefined1  [8])local_c0;
    auStack_170._0_8_ = local_c8.data_;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
    std::__cxx11::string::_M_construct((ulong)&local_a8,-0x24);
    local_108 = (undefined1  [8])local_a0._M_p;
    local_100 = local_a8;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_128,(lts_20250127 *)local_178,(AlphaNum *)local_108,(AlphaNum *)local_a0._M_p)
    ;
    testing::internal::CmpHelperEQ<absl::lts_20250127::Cord,std::__cxx11::string>
              (local_d8,"cord","absl::StrCat(std::string(500, \'a\'), std::string(1500, \'b\'))",
               (Cord *)&local_138.as_tree,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98) {
      operator_delete(local_a8,(ulong)(local_98._0_8_ + 1));
    }
    if (local_c8.data_ != (AssertHelperData *)local_b8) {
      operator_delete(local_c8.data_,local_b8._0_8_ + 1);
    }
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_178);
      if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = (local_d0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x4b0,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
      if (local_178 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_178 + 8))();
      }
    }
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b60c49;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_d0;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_d0);
LAB_00b60c49:
  if ((local_80.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_80.buffer_.rep_.field_0._1_7_,
                        local_80.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_80.cord_);
  absl::lts_20250127::Cord::~Cord((Cord *)&local_138.as_tree);
  return;
}

Assistant:

void IoTest::WriteString(ZeroCopyOutputStream* output, const std::string& str) {
  EXPECT_TRUE(WriteToOutput(output, str.c_str(), str.size()));
}